

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O1

_Bool XPKView_LoadXPKEntry(void)

{
  int iVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar2;
  undefined8 in_RAX;
  uint8_t *rgba;
  char *pcVar3;
  undefined8 uVar4;
  LPStatus status;
  LPStatus local_14;
  
  local_14 = (LPStatus)((ulong)in_RAX >> 0x20);
  if (app.xpkentry_tx != (SDL_Texture *)0x0) {
    SDL_DestroyTexture();
  }
  app.xpkentry = XPK_EntryAtIndex(app.xpk,app.which_entry);
  rgba = XPKEntry_Decode(app.xpkentry,&local_14);
  iVar1 = app.which_entry;
  if (local_14 == LUNAPURPURA_OK) {
    uVar4 = SDL_CreateRGBSurfaceWithFormatFrom
                      (rgba,(app.xpkentry)->width,(app.xpkentry)->height,0x20,
                       (uint)(app.xpkentry)->width * 4,0x16762004);
    app.xpkentry_tx = (SDL_Texture *)SDL_CreateTextureFromSurface(app.renderer,uVar4);
    SDL_FreeSurface(uVar4);
    XPKDecoder_FreeRGBA(rgba);
    app.entry_rect.x = (int)(app.xpkentry)->x;
    app.entry_rect.y = (int)(app.xpkentry)->y;
    app.entry_rect.w = (int)(app.xpkentry)->width;
    app.entry_rect.h = (int)(app.xpkentry)->height;
    XPKView_ToggleCentered();
    XPKView_ToggleCentered();
    uVar2 = extraout_AL_00;
  }
  else {
    pcVar3 = LPStatusString(local_14);
    LPWarn("xpkview","Couldn\'t decode XPK entry #%d! - %s",(ulong)(uint)iVar1,pcVar3);
    uVar2 = extraout_AL;
  }
  return (_Bool)uVar2;
}

Assistant:

static bool
XPKView_LoadXPKEntry(void)
{
	if (app.xpkentry_tx) SDL_DestroyTexture(app.xpkentry_tx);

	app.xpkentry = XPK_EntryAtIndex(app.xpk, app.which_entry);

	LPStatus status;
	uint8_t *rgba = XPKEntry_Decode(app.xpkentry, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "Couldn't decode XPK entry #%d! - %s", app.which_entry, LPStatusString(status));
		return false;
	}

	SDL_Surface *surf = SDL_CreateRGBSurfaceWithFormatFrom(
		rgba, app.xpkentry->width, app.xpkentry->height, 32, app.xpkentry->width*4, SDL_PIXELFORMAT_RGBA32
	);
	app.xpkentry_tx = SDL_CreateTextureFromSurface(app.renderer, surf);
	SDL_FreeSurface(surf);
	XPKDecoder_FreeRGBA(rgba);

	app.entry_rect.x = app.xpkentry->x;
	app.entry_rect.y = app.xpkentry->y;
	app.entry_rect.w = app.xpkentry->width;
	app.entry_rect.h = app.xpkentry->height;

	/* Do this twice on purpose so that we preserve the current setting. */
	XPKView_ToggleCentered();
	XPKView_ToggleCentered();

	return true;
}